

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

bool readFromFile<float,short>(string *fname,TWaveformT<short> *res)

{
  int iVar1;
  streamsize size;
  ifstream fin;
  int aiStack_200 [122];
  
  std::ifstream::ifstream(&fin,(string *)fname,_S_bin|_S_ate);
  iVar1 = *(int *)((long)aiStack_200 + *(long *)(_fin + -0x18));
  if (iVar1 == 0) {
    size = std::istream::tellg();
    std::istream::seekg((long)&fin,_S_beg);
    (anonymous_namespace)::readWaveform<float,short>(&fin,res,0,size);
    std::ifstream::close();
  }
  std::ifstream::~ifstream(&fin);
  return iVar1 == 0;
}

Assistant:

bool readFromFile(const std::string & fname, TWaveformT<TSample> & res) {
    std::ifstream fin(fname, std::ios::binary | std::ios::ate);
    if (fin.good() == false) {
        return false;
    }

    {
        std::streamsize size = fin.tellg();
        fin.seekg(0, std::ios::beg);

        static_assert(std::is_same<TSampleInput, TSampleF>::value, "TSampleInput not supported");
        static_assert(std::is_same<TSample, TSampleF>::value ||
                      std::is_same<TSample, TSampleI16>::value, "TSample not supported");

        if (readWaveform<TSampleInput>(fin, res, 0, size) == false) {
            return false;
        }
    }

    fin.close();

    return true;
}